

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

int EstimateStripByteCounts(TIFF *tif,TIFFDirEntry *dir,uint16_t dircount)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  uint64_t *puVar4;
  toff_t tVar5;
  uint64_t uVar6;
  uint32_t rowsperstrip;
  uint64_t rowbytes;
  uint64_t bytespertile;
  uint64_t datasize;
  uint32_t typewidth;
  uint16_t n;
  uint64_t filesize;
  uint64_t space;
  uint32_t strip;
  TIFFDirectory *td;
  TIFFDirEntry *dp;
  uint16_t dircount_local;
  TIFFDirEntry *dir_local;
  TIFF *tif_local;
  
  iVar2 = _TIFFFillStrilesInternal(tif,0);
  if (iVar2 == 0) {
    tif_local._4_4_ = -1;
  }
  else {
    if ((tif->tif_dir).td_stripbytecount_p != (uint64_t *)0x0) {
      _TIFFfreeExt(tif,(tif->tif_dir).td_stripbytecount_p);
    }
    puVar4 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripByteCounts\" array"
                             );
    (tif->tif_dir).td_stripbytecount_p = puVar4;
    if ((tif->tif_dir).td_stripbytecount_p == (uint64_t *)0x0) {
      tif_local._4_4_ = -1;
    }
    else {
      if ((tif->tif_dir).td_compression == 1) {
        if ((tif->tif_flags & 0x400) == 0) {
          uVar6 = TIFFScanlineSize64(tif);
          uVar3 = (tif->tif_dir).td_imagelength / (tif->tif_dir).td_stripsperimage;
          for (space._4_4_ = 0; space._4_4_ < (tif->tif_dir).td_nstrips;
              space._4_4_ = space._4_4_ + 1) {
            if ((uVar6 != 0) &&
               (auVar1._8_8_ = 0, auVar1._0_8_ = uVar6,
               SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < (ulong)uVar3)
               ) {
              return -1;
            }
            (tif->tif_dir).td_stripbytecount_p[space._4_4_] = uVar6 * uVar3;
          }
        }
        else {
          uVar6 = TIFFTileSize64(tif);
          for (space._4_4_ = 0; space._4_4_ < (tif->tif_dir).td_nstrips;
              space._4_4_ = space._4_4_ + 1) {
            (tif->tif_dir).td_stripbytecount_p[space._4_4_] = uVar6;
          }
        }
      }
      else {
        tVar5 = (*tif->tif_sizeproc)(tif->tif_clientdata);
        datasize._6_2_ = dircount;
        td = (TIFFDirectory *)dir;
        if ((tif->tif_flags & 0x80000) == 0) {
          filesize = (long)(int)((uint)dircount * 0xc) + 0xe;
        }
        else {
          filesize = (long)(int)((uint)dircount * 0x14) + 0x20;
        }
        for (; datasize._6_2_ != 0; datasize._6_2_ = datasize._6_2_ - 1) {
          uVar3 = TIFFDataWidth((uint)*(ushort *)((long)td->td_fieldsset + 2));
          if (uVar3 == 0) {
            TIFFErrorExtR(tif,"EstimateStripByteCounts",
                          "Cannot determine size of unknown tag type %u",
                          (ulong)*(ushort *)((long)td->td_fieldsset + 2));
            return -1;
          }
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / ZEXT416(uVar3),0) <
              *(ulong *)(td->td_fieldsset + 2)) {
            return -1;
          }
          bytespertile = (ulong)uVar3 * *(long *)(td->td_fieldsset + 2);
          if ((tif->tif_flags & 0x80000) == 0) {
            if (bytespertile < 5) {
              bytespertile = 0;
            }
          }
          else if (bytespertile < 9) {
            bytespertile = 0;
          }
          if (-bytespertile - 1 < filesize) {
            return -1;
          }
          filesize = bytespertile + filesize;
          td = (TIFFDirectory *)&td->td_tilelength;
        }
        uVar6 = tVar5;
        if (filesize <= tVar5) {
          uVar6 = tVar5 - filesize;
        }
        filesize = uVar6;
        if ((tif->tif_dir).td_planarconfig == 2) {
          filesize = filesize / (tif->tif_dir).td_samplesperpixel;
        }
        for (space._4_4_ = 0; space._4_4_ < (tif->tif_dir).td_nstrips; space._4_4_ = space._4_4_ + 1
            ) {
          (tif->tif_dir).td_stripbytecount_p[space._4_4_] = filesize;
        }
        uVar3 = space._4_4_ - 1;
        if (-(tif->tif_dir).td_stripbytecount_p[uVar3] - 1 < (tif->tif_dir).td_stripoffset_p[uVar3])
        {
          return -1;
        }
        if (tVar5 < (tif->tif_dir).td_stripoffset_p[uVar3] +
                    (tif->tif_dir).td_stripbytecount_p[uVar3]) {
          if ((tif->tif_dir).td_stripoffset_p[uVar3] < tVar5) {
            (tif->tif_dir).td_stripbytecount_p[uVar3] =
                 tVar5 - (tif->tif_dir).td_stripoffset_p[uVar3];
          }
          else {
            (tif->tif_dir).td_stripbytecount_p[uVar3] = 0;
          }
        }
      }
      (tif->tif_dir).td_fieldsset[0] = (tif->tif_dir).td_fieldsset[0] | 0x1000000;
      if (((tif->tif_dir).td_fieldsset[0] & 0x20000) == 0) {
        (tif->tif_dir).td_rowsperstrip = (tif->tif_dir).td_imagelength;
      }
      tif_local._4_4_ = 1;
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int EstimateStripByteCounts(TIFF *tif, TIFFDirEntry *dir,
                                   uint16_t dircount)
{
    static const char module[] = "EstimateStripByteCounts";

    TIFFDirEntry *dp;
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t strip;

    /* Do not try to load stripbytecount as we will compute it */
    if (!_TIFFFillStrilesInternal(tif, 0))
        return -1;

    if (td->td_stripbytecount_p)
        _TIFFfreeExt(tif, td->td_stripbytecount_p);
    td->td_stripbytecount_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripByteCounts\" array");
    if (td->td_stripbytecount_p == NULL)
        return -1;

    if (td->td_compression != COMPRESSION_NONE)
    {
        uint64_t space;
        uint64_t filesize;
        uint16_t n;
        filesize = TIFFGetFileSize(tif);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
            space = sizeof(TIFFHeaderClassic) + 2 + dircount * 12 + 4;
        else
            space = sizeof(TIFFHeaderBig) + 8 + dircount * 20 + 8;
        /* calculate amount of space used by indirect values */
        for (dp = dir, n = dircount; n > 0; n--, dp++)
        {
            uint32_t typewidth;
            uint64_t datasize;
            typewidth = TIFFDataWidth((TIFFDataType)dp->tdir_type);
            if (typewidth == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Cannot determine size of unknown tag type %" PRIu16,
                    dp->tdir_type);
                return -1;
            }
            if (dp->tdir_count > UINT64_MAX / typewidth)
                return -1;
            datasize = (uint64_t)typewidth * dp->tdir_count;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                if (datasize <= 4)
                    datasize = 0;
            }
            else
            {
                if (datasize <= 8)
                    datasize = 0;
            }
            if (space > UINT64_MAX - datasize)
                return -1;
            space += datasize;
        }
        if (filesize < space)
            /* we should perhaps return in error ? */
            space = filesize;
        else
            space = filesize - space;
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
            space /= td->td_samplesperpixel;
        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = space;
        /*
         * This gross hack handles the case were the offset to
         * the last strip is past the place where we think the strip
         * should begin.  Since a strip of data must be contiguous,
         * it's safe to assume that we've overestimated the amount
         * of data in the strip and trim this number back accordingly.
         */
        strip--;
        if (td->td_stripoffset_p[strip] >
            UINT64_MAX - td->td_stripbytecount_p[strip])
            return -1;
        if (td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip] >
            filesize)
        {
            if (td->td_stripoffset_p[strip] >= filesize)
            {
                /* Not sure what we should in that case... */
                td->td_stripbytecount_p[strip] = 0;
            }
            else
            {
                td->td_stripbytecount_p[strip] =
                    filesize - td->td_stripoffset_p[strip];
            }
        }
    }
    else if (isTiled(tif))
    {
        uint64_t bytespertile = TIFFTileSize64(tif);

        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = bytespertile;
    }
    else
    {
        uint64_t rowbytes = TIFFScanlineSize64(tif);
        uint32_t rowsperstrip = td->td_imagelength / td->td_stripsperimage;
        for (strip = 0; strip < td->td_nstrips; strip++)
        {
            if (rowbytes > 0 && rowsperstrip > UINT64_MAX / rowbytes)
                return -1;
            td->td_stripbytecount_p[strip] = rowbytes * rowsperstrip;
        }
    }
    TIFFSetFieldBit(tif, FIELD_STRIPBYTECOUNTS);
    if (!TIFFFieldSet(tif, FIELD_ROWSPERSTRIP))
        td->td_rowsperstrip = td->td_imagelength;
    return 1;
}